

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

rect2d * __thiscall rengine::rect2d::operator|=(rect2d *this,vec2 p)

{
  float *pfVar1;
  rect2d *this_local;
  vec2 p_local;
  
  this_local._0_4_ = p.x;
  if (this_local._0_4_ < (this->tl).x) {
    (this->tl).x = this_local._0_4_;
  }
  this_local._4_4_ = p.y;
  if (this_local._4_4_ < (this->tl).y) {
    (this->tl).y = this_local._4_4_;
  }
  if ((this->br).x <= this_local._0_4_ && this_local._0_4_ != (this->br).x) {
    (this->br).x = this_local._0_4_;
  }
  pfVar1 = &(this->br).y;
  if (*pfVar1 <= this_local._4_4_ && this_local._4_4_ != *pfVar1) {
    (this->br).y = this_local._4_4_;
  }
  return this;
}

Assistant:

rect2d &operator|=(vec2 p) {
        if (p.x < tl.x) tl.x = p.x;
        if (p.y < tl.y) tl.y = p.y;
        if (p.x > br.x) br.x = p.x;
        if (p.y > br.y) br.y = p.y;
        return *this;
    }